

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_525a::StreambufStream::~StreambufStream(StreambufStream *this)

{
  ~StreambufStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~StreambufStream()
    {
        EXPECT_TRUE(_destructed) << "ktxStream should have been destructed";
    }